

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool parseDouble(Option *O,StringRef Arg,double *Value)

{
  bool bVar1;
  raw_ostream *Errs;
  StringRef local_80;
  Twine local_70;
  Twine local_58;
  Twine local_40;
  
  local_80.Length = Arg.Length;
  local_80.Data = Arg.Data;
  llvm::Twine::Twine(&local_70,&local_80);
  bVar1 = llvm::to_float(&local_70,Value);
  if (!bVar1) {
    llvm::Twine::Twine(&local_40,"\'",&local_80);
    llvm::Twine::Twine(&local_58,"\' value invalid for floating point argument!");
    llvm::Twine::concat(&local_70,&local_40,&local_58);
    Errs = llvm::errs();
    llvm::cl::Option::error(O,&local_70,(StringRef)ZEXT816(0),Errs);
  }
  return !bVar1;
}

Assistant:

static bool parseDouble(Option &O, StringRef Arg, double &Value) {
  if (to_float(Arg, Value))
    return false;
  return O.error("'" + Arg + "' value invalid for floating point argument!");
}